

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O0

void __thiscall AI::WorldState::pushChanges(WorldState *this,Task *task)

{
  bool bVar1;
  reference __k;
  mapped_type *__a;
  mapped_type *__b;
  reference __k_00;
  mapped_type_conflict *__a_00;
  mapped_type_conflict *__b_00;
  mapped_type *__a_01;
  mapped_type *__b_01;
  undefined1 local_1d8 [8];
  StateChanges changed;
  pair<const_WorldStateIdentifier,_Math::Vector3> *vector;
  iterator __end1_2;
  iterator __begin1_2;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  *__range1_2;
  pair<const_WorldStateIdentifier,_float> *value;
  iterator __end1_1;
  iterator __begin1_1;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *__range1_1;
  pair<const_WorldStateIdentifier,_bool> *flag;
  iterator __end1;
  iterator __begin1;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  *__range1;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  copiedVectors;
  undefined1 local_78 [8];
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  copiedValues;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  copiedFlags;
  Task *task_local;
  WorldState *this_local;
  
  std::
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::map((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
         *)&copiedValues._M_t._M_impl.super__Rb_tree_header._M_node_count,&task->modifiedFlags);
  std::
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::map((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
         *)local_78,&task->modifiedValues);
  std::
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::map((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
         *)&__range1,&task->modifiedVectors);
  __end1 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::begin(&task->modifiedFlags);
  flag = (pair<const_WorldStateIdentifier,_bool> *)
         std::
         map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
         ::end(&task->modifiedFlags);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&flag);
    if (!bVar1) break;
    __k = std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator*(&__end1);
    __a = std::
          map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
          ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                        *)&copiedValues._M_t._M_impl.super__Rb_tree_header._M_node_count,&__k->first
                      );
    __b = std::
          map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
          ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                        *)this,&__k->first);
    std::swap<bool>(__a,__b);
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator++(&__end1);
  }
  __end1_1 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::begin(&task->modifiedValues);
  value = (pair<const_WorldStateIdentifier,_float> *)
          std::
          map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
          ::end(&task->modifiedValues);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&value);
    if (!bVar1) break;
    __k_00 = std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>::operator*
                       (&__end1_1);
    __a_00 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[]((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                           *)local_78,&__k_00->first);
    __b_00 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](&(this->current).values,&__k_00->first);
    std::swap<float>(__a_00,__b_00);
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>::operator++(&__end1_1);
  }
  __end1_2 = std::
             map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
             ::begin(&task->modifiedVectors);
  vector = (pair<const_WorldStateIdentifier,_Math::Vector3> *)
           std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::end(&task->modifiedVectors);
  while( true ) {
    bVar1 = std::operator!=(&__end1_2,(_Self *)&vector);
    if (!bVar1) break;
    changed.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>::
                 operator*(&__end1_2);
    __a_01 = std::
             map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
             ::operator[]((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
                           *)&__range1,
                          (key_type *)
                          changed.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
    __b_01 = std::
             map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
             ::operator[](&(this->current).vectors,
                          (key_type *)
                          changed.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
    std::swap<Math::Vector3>(__a_01,__b_01);
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>::operator++
              (&__end1_2);
  }
  StateChanges::StateChanges((StateChanges *)local_1d8);
  std::
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::operator=((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               *)local_1d8,
              (map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               *)&copiedValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::operator=((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
               *)&changed.state.flags._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
               *)local_78);
  std::
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::operator=((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
               *)&changed.state.values._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
               *)&__range1);
  std::vector<AI::StateChanges,std::allocator<AI::StateChanges>>::emplace_back<AI::StateChanges&>
            ((vector<AI::StateChanges,std::allocator<AI::StateChanges>> *)&this->changes,
             (StateChanges *)local_1d8);
  StateChanges::~StateChanges((StateChanges *)local_1d8);
  std::
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::~map((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
          *)&__range1);
  std::
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::~map((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
          *)local_78);
  std::
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~map((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
          *)&copiedValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void WorldState::pushChanges(Task& task)
	{
		auto copiedFlags = task.modifiedFlags;
		auto copiedValues = task.modifiedValues;
		auto copiedVectors = task.modifiedVectors;

		for (auto& flag : task.modifiedFlags)
		{			
			std::swap(copiedFlags[flag.first], current.flags[flag.first]);
		}

		for (auto& value : task.modifiedValues)
		{			
			std::swap(copiedValues[value.first], current.values[value.first]);
		}

		for (auto& vector : task.modifiedVectors)
		{
			std::swap(copiedVectors[vector.first], current.vectors[vector.first]);
		}

		StateChanges changed;
		changed.state.flags = std::move(copiedFlags);
		changed.state.values = std::move(copiedValues);
		changed.state.vectors = std::move(copiedVectors);

		changes.emplace_back(changed);
	}